

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O1

int __thiscall
crnlib::dynamic_string::deserialize
          (dynamic_string *this,void *pBuf,uint buf_size,bool little_endian)

{
  uint buf_left;
  int iVar1;
  ushort uVar2;
  undefined1 auVar3 [16];
  
  iVar1 = -1;
  if (1 < buf_size) {
    if (little_endian) {
      uVar2 = *pBuf;
    }
    else {
      auVar3 = psllw(ZEXT216(*pBuf),8);
      uVar2 = auVar3._0_2_ | *pBuf >> 8;
    }
    if ((uint)uVar2 <= buf_size - 2) {
      set_from_buf(this,(void *)((long)pBuf + 2),(uint)uVar2);
      iVar1 = uVar2 + 2;
    }
  }
  return iVar1;
}

Assistant:

int dynamic_string::deserialize(const void* pBuf, uint buf_size, bool little_endian) {
  uint buf_left = buf_size;

  if (buf_left < sizeof(uint16))
    return -1;

  uint16 l;
  if (!utils::read_obj(l, pBuf, buf_left, little_endian))
    return -1;

  if (buf_left < l)
    return -1;

  set_from_buf(pBuf, l);

  buf_left -= l;

  return buf_size - buf_left;
}